

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall
ON_UuidPairList::AddPair(ON_UuidPairList *this,ON_UUID id1,ON_UUID id2,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidPair *pOVar2;
  byte local_59;
  ON_UuidPair *ui;
  bool local_32;
  bool rc;
  bool bCheckForDupicates_local;
  ON_UuidPairList *this_local;
  ON_UUID id2_local;
  ON_UUID id1_local;
  
  id2_local._0_8_ = id2.Data4;
  this_local = id2._0_8_;
  id2_local.Data4 = id1._0_8_;
  if (bCheckForDupicates) {
    bVar1 = FindId1(this,id1,(ON_UUID *)0x0);
    local_59 = bVar1 ^ 0xff;
  }
  else {
    local_59 = 1;
  }
  local_32 = (bool)(local_59 & 1);
  if (local_32 != false) {
    bVar1 = ::operator==(&ON_max_uuid,(ON_UUID_struct *)id2_local.Data4);
    if ((bVar1) && (bVar1 = ::operator==(&ON_max_uuid,(ON_UUID_struct *)&this_local), bVar1)) {
      local_32 = false;
    }
    else {
      pOVar2 = ON_SimpleArray<ON_UuidPair>::AppendNew(&this->super_ON_SimpleArray<ON_UuidPair>);
      *(uchar (*) [8])pOVar2->m_uuid = id2_local.Data4;
      *&pOVar2->m_uuid[0].Data4 = id1.Data4;
      *(ON_UuidPairList **)(pOVar2->m_uuid + 1) = this_local;
      *(undefined8 *)pOVar2->m_uuid[1].Data4 = id2_local._0_8_;
    }
  }
  return local_32;
}

Assistant:

bool ON_UuidPairList::AddPair(ON_UUID id1, ON_UUID id2, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindId1(id1,0) : true;
  if (rc)
  {
    if ( ON_max_uuid == id1 && ON_max_uuid == id2 )
    {
      // The value pair (ON_max_uuid,ON_max_uuid) is used
      // to mark removed elements.
      rc = false;
    }
    else
    {
      ON_UuidPair& ui = AppendNew();
      ui.m_uuid[0] = id1;
      ui.m_uuid[1] = id2;
    }
  }
  return rc;
}